

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O3

void __thiscall
BackwardPass::InsertTypeTransitionAtBlock
          (BackwardPass *this,BasicBlock *block,int symId,AddPropertyCacheBucket *data,
          BVSparse<Memory::JitArenaAllocator> *upwardExposedUses)

{
  Instr **ppIVar1;
  Opnd *pOVar2;
  _func_int **pp_Var3;
  code *pcVar4;
  bool bVar5;
  OpndKind OVar6;
  undefined4 *puVar7;
  Instr *pIVar8;
  BasicBlock *pBVar9;
  JITType *pJVar10;
  _func_int **pp_Var11;
  Instr *pIVar12;
  long lVar13;
  Instr *this_00;
  Func **ppFVar14;
  Func **ppFVar15;
  long lVar16;
  JITTypeHolderBase<void> local_68;
  JITTypeHolderBase<void> local_60;
  BasicBlock *local_58;
  Func **local_50;
  BVSparse<Memory::JitArenaAllocator> *local_48;
  BackwardPass *local_40;
  AddPropertyCacheBucket *local_38;
  
  pBVar9 = block->next;
  ppFVar15 = &block->func;
  ppFVar14 = (Func **)&pBVar9->firstInstr;
  if (pBVar9 == (BasicBlock *)0x0) {
    ppFVar14 = ppFVar15;
  }
  lVar16 = 0x18;
  if (pBVar9 == (BasicBlock *)0x0) {
    lVar16 = 0xd0;
  }
  lVar16 = *(long *)((long)&(*ppFVar14)->m_alloc + lVar16);
  if (lVar16 == 0) {
    pIVar12 = (Instr *)0x0;
  }
  else {
    pIVar12 = *(Instr **)(lVar16 + 0x10);
  }
  this_00 = block->firstInstr;
  if (this_00 != pIVar12) {
    local_58 = block;
    local_50 = ppFVar15;
    local_48 = upwardExposedUses;
    local_40 = this;
    local_38 = data;
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    pIVar8 = (Instr *)0x0;
    do {
      if ((pIVar8 != (Instr *)0x0) && (pIVar8->m_next != this_00)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar7 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                           ,0x1787,
                           "(__prevInstrCheck == nullptr || __prevInstrCheck->m_next == instr)",
                           "Modifying instr list but not using EDITING iterator!");
        if (!bVar5) goto LAB_003e8166;
        *puVar7 = 0;
      }
      bVar5 = IR::Instr::IsRealInstr(this_00);
      if (bVar5) {
        data = local_38;
        this = local_40;
        upwardExposedUses = local_48;
        if (this_00->m_opcode != AdjustObjType) goto LAB_003e8006;
        pOVar2 = this_00->m_src1;
        OVar6 = IR::Opnd::GetKind(pOVar2);
        if (OVar6 != OpndKindReg) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar7 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                             ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
          if (!bVar5) goto LAB_003e8166;
          *puVar7 = 0;
        }
        if (*(int *)(pOVar2[1]._vptr_Opnd + 2) == symId) {
          pOVar2 = this_00->m_dst;
          OVar6 = IR::Opnd::GetKind(pOVar2);
          if (OVar6 != OpndKindAddr) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar7 = 1;
            bVar5 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                               ,0x18e,"(this->IsAddrOpnd())","Bad call to AsAddrOpnd()");
            if (!bVar5) goto LAB_003e8166;
            *puVar7 = 0;
          }
          pp_Var3 = pOVar2[2]._vptr_Opnd;
          local_68.t = (local_38->finalType).t;
          pJVar10 = JITTypeHolderBase<void>::operator->(&local_68);
          pp_Var11 = (_func_int **)JITType::GetAddr(pJVar10);
          if (pp_Var11 == pp_Var3) {
            pOVar2 = this_00->m_src2;
            OVar6 = IR::Opnd::GetKind(pOVar2);
            if (OVar6 != OpndKindAddr) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar7 = 1;
              bVar5 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                                 ,0x18e,"(this->IsAddrOpnd())","Bad call to AsAddrOpnd()");
              if (!bVar5) goto LAB_003e8166;
              *puVar7 = 0;
            }
            pp_Var3 = pOVar2[2]._vptr_Opnd;
            local_60.t = (local_38->initialType).t;
            pJVar10 = JITTypeHolderBase<void>::operator->(&local_60);
            pp_Var11 = (_func_int **)JITType::GetAddr(pJVar10);
            if (pp_Var11 == pp_Var3) {
              return;
            }
          }
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar7 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                             ,0x1794,
                             "((intptr_t)instr->GetDst()->AsAddrOpnd()->m_address == data->GetFinalType()->GetAddr() && (intptr_t)instr->GetSrc2()->AsAddrOpnd()->m_address == data->GetInitialType()->GetAddr())"
                             ,
                             "(intptr_t)instr->GetDst()->AsAddrOpnd()->m_address == data->GetFinalType()->GetAddr() && (intptr_t)instr->GetSrc2()->AsAddrOpnd()->m_address == data->GetInitialType()->GetAddr()"
                            );
          if (bVar5) {
            *puVar7 = 0;
            return;
          }
          goto LAB_003e8166;
        }
      }
      ppIVar1 = &this_00->m_next;
      pIVar8 = this_00;
      this_00 = *ppIVar1;
    } while (*ppIVar1 != pIVar12);
    pBVar9 = local_58->next;
    data = local_38;
    block = local_58;
    this = local_40;
    upwardExposedUses = local_48;
    ppFVar15 = local_50;
  }
  ppFVar14 = (Func **)&pBVar9->firstInstr;
  if (pBVar9 == (BasicBlock *)0x0) {
    ppFVar14 = ppFVar15;
  }
  lVar13 = 0x18;
  lVar16 = 0x18;
  if (pBVar9 == (BasicBlock *)0x0) {
    lVar16 = 0xd0;
  }
  if (*(long *)(*(long *)((long)&(*ppFVar14)->m_alloc + lVar16) + 0x10) == 0) {
    AssertCount = AssertCount + 1;
    local_50 = ppFVar15;
    local_48 = upwardExposedUses;
    local_40 = this;
    local_38 = data;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x17a4,"(block->GetLastInstr()->m_next)","block->GetLastInstr()->m_next");
    if (!bVar5) {
LAB_003e8166:
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar7 = 0;
    pBVar9 = block->next;
    data = local_38;
    this = local_40;
    upwardExposedUses = local_48;
    ppFVar15 = local_50;
  }
  ppFVar14 = (Func **)&pBVar9->firstInstr;
  if (pBVar9 == (BasicBlock *)0x0) {
    lVar13 = 0xd0;
    ppFVar14 = ppFVar15;
  }
  this_00 = *(Instr **)(*(long *)((long)&(*ppFVar14)->m_alloc + lVar13) + 0x10);
LAB_003e8006:
  InsertTypeTransition(this,this_00,symId,data,upwardExposedUses);
  return;
}

Assistant:

void
BackwardPass::InsertTypeTransitionAtBlock(BasicBlock *block, int symId, AddPropertyCacheBucket *data, BVSparse<JitArenaAllocator>* upwardExposedUses)
{
    bool inserted = false;
    FOREACH_INSTR_IN_BLOCK(instr, block)
    {
        if (instr->IsRealInstr())
        {
            // Check for pre-existing type transition. There may be more than one AdjustObjType here,
            // so look at them all.
            if (instr->m_opcode == Js::OpCode::AdjustObjType)
            {
                if (instr->GetSrc1()->AsRegOpnd()->m_sym->m_id == (SymID)symId)
                {
                    // This symbol already has a type transition at this point.
                    // It *must* be doing the same transition we're already trying to do.
                    Assert((intptr_t)instr->GetDst()->AsAddrOpnd()->m_address == data->GetFinalType()->GetAddr() &&
                           (intptr_t)instr->GetSrc2()->AsAddrOpnd()->m_address == data->GetInitialType()->GetAddr());
                    // Nothing to do.
                    return;
                }
            }
            else
            {
                this->InsertTypeTransition(instr, symId, data, upwardExposedUses);
                inserted = true;
                break;
            }
        }
    }
    NEXT_INSTR_IN_BLOCK;
    if (!inserted)
    {
        Assert(block->GetLastInstr()->m_next);
        this->InsertTypeTransition(block->GetLastInstr()->m_next, symId, data, upwardExposedUses);
    }
}